

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::(anonymous_namespace)::BlockSizes_SkipInput_Test::~BlockSizes_SkipInput_Test
          (BlockSizes_SkipInput_Test *this)

{
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x18);
  return;
}

Assistant:

TEST_P(BlockSizes, SkipInput) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kSkipTestBytes, sizeof(kSkipTestBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, strlen("<Before skipping>")));
    EXPECT_EQ("<Before skipping>", str);
    EXPECT_TRUE(coded_input.Skip(strlen("<To be skipped>")));
    EXPECT_TRUE(coded_input.ReadString(&str, strlen("<After skipping>")));
    EXPECT_EQ("<After skipping>", str);
  }

  EXPECT_EQ(strlen(kSkipTestBytes), input.ByteCount());
}